

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doh.c
# Opt level: O0

DOHcode store_a(uchar *doh,int index,dohentry *d)

{
  int iVar1;
  dohaddr *a;
  dohentry *d_local;
  int index_local;
  uchar *doh_local;
  
  if (d->numaddr < 0x18) {
    iVar1 = d->numaddr;
    d->addr[iVar1].type = 1;
    *(undefined4 *)&d->addr[iVar1].ip = *(undefined4 *)(doh + index);
    d->numaddr = d->numaddr + 1;
  }
  return DOH_OK;
}

Assistant:

static DOHcode store_a(unsigned char *doh, int index, struct dohentry *d)
{
  /* silently ignore addresses over the limit */
  if(d->numaddr < DOH_MAX_ADDR) {
    struct dohaddr *a = &d->addr[d->numaddr];
    a->type = DNS_TYPE_A;
    memcpy(&a->ip.v4, &doh[index], 4);
    d->numaddr++;
  }
  return DOH_OK;
}